

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInstancesProcess.cpp
# Opt level: O2

void UpdateMeshIndices(aiNode *node,uint *lookup)

{
  uint n;
  ulong uVar1;
  uint n_1;
  
  for (uVar1 = 0; uVar1 < node->mNumMeshes; uVar1 = uVar1 + 1) {
    node->mMeshes[uVar1] = lookup[node->mMeshes[uVar1]];
  }
  for (uVar1 = 0; uVar1 < node->mNumChildren; uVar1 = uVar1 + 1) {
    UpdateMeshIndices(node->mChildren[uVar1],lookup);
  }
  return;
}

Assistant:

void UpdateMeshIndices(aiNode* node, unsigned int* lookup)
{
    for (unsigned int n = 0; n < node->mNumMeshes;++n)
        node->mMeshes[n] = lookup[node->mMeshes[n]];

    for (unsigned int n = 0; n < node->mNumChildren;++n)
        UpdateMeshIndices(node->mChildren[n],lookup);
}